

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_locate_between(REF_INTERP ref_interp,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  int iVar1;
  REF_AGENT_MODE RVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_AGENT_STRUCT *pRVar6;
  REF_DBL *pRVar7;
  REF_INT node;
  long lVar8;
  uint uVar9;
  long lVar10;
  undefined8 uVar11;
  uint unaff_EBP;
  REF_AGENTS ref_agents;
  bool bVar12;
  REF_INT id;
  REF_LIST ref_list;
  REF_INT local_5c;
  REF_NODE local_58;
  REF_AGENTS local_50;
  long local_48;
  REF_MPI local_40;
  REF_LIST local_38;
  
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7a4,
           "ref_interp_locate_between","ref_interp NULL");
    return 2;
  }
  local_40 = ref_interp->ref_mpi;
  pRVar3 = ref_interp->to_grid->node;
  if ((ref_interp->max <= new_node) &&
     (unaff_EBP = ref_interp_resize(ref_interp,pRVar3->max), unaff_EBP != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7aa,
           "ref_interp_locate_between",(ulong)unaff_EBP,"resize");
    return unaff_EBP;
  }
  local_48 = (long)new_node;
  ref_interp->cell[local_48] = -1;
  ref_agents = ref_interp->ref_agents;
  iVar1 = ref_agents->n;
  local_58 = pRVar3;
  if ((long)iVar1 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7af,
           "ref_interp_locate_between","did not expect active agents",0,(long)iVar1);
    unaff_EBP = 1;
  }
  lVar8 = local_48;
  if (iVar1 != 0) {
    return unaff_EBP;
  }
  local_5c = -1;
  node = (REF_INT)local_48;
  if (node0 != -1) {
    pRVar4 = ref_interp->cell;
    if ((pRVar4[node0] != -1) && (pRVar5 = ref_interp->part, local_40->id == pRVar5[node0])) {
      ref_interp->agent_hired[local_48] = 1;
      local_50 = ref_agents;
      uVar9 = ref_agents_push(ref_agents,node,pRVar5[node0],pRVar4[node0],
                              local_58->real + node * 0xf,&local_5c);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7ba,"ref_interp_locate_between",(ulong)uVar9,"requeue");
        return uVar9;
      }
      RVar2 = local_50->agent[local_5c].mode;
      if ((ulong)RVar2 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7bb,"ref_interp_locate_between","not walking?",1,(ulong)RVar2);
        unaff_EBP = 1;
      }
      if (RVar2 != REF_AGENT_WALKING) {
        return unaff_EBP;
      }
      uVar9 = ref_interp_walk_agent(ref_interp,local_5c);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7bc,"ref_interp_locate_between",(ulong)uVar9,"walking");
        return uVar9;
      }
      ref_agents = local_50;
      if (local_50->agent[local_5c].mode != REF_AGENT_ENCLOSING) {
        ref_interp->agent_hired[lVar8] = 0;
        uVar9 = ref_agents_remove(local_50,local_5c);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7bf,"ref_interp_locate_between",(ulong)uVar9,"no longer needed");
          return uVar9;
        }
        local_5c = -1;
        ref_agents = local_50;
      }
    }
  }
  if ((node1 != -1) && (local_5c == -1)) {
    pRVar4 = ref_interp->cell;
    if ((pRVar4[node1] != -1) && (pRVar5 = ref_interp->part, local_40->id == pRVar5[node1])) {
      ref_interp->agent_hired[lVar8] = 1;
      uVar9 = ref_agents_push(ref_agents,node,pRVar5[node1],pRVar4[node1],
                              local_58->real + node * 0xf,&local_5c);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7cb,"ref_interp_locate_between",(ulong)uVar9,"requeue");
        return uVar9;
      }
      RVar2 = ref_agents->agent[local_5c].mode;
      if ((ulong)RVar2 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7cc,"ref_interp_locate_between","not walking?",1,(ulong)RVar2);
        unaff_EBP = 1;
      }
      if (RVar2 != REF_AGENT_WALKING) {
        return unaff_EBP;
      }
      uVar9 = ref_interp_walk_agent(ref_interp,local_5c);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7cd,"ref_interp_locate_between",(ulong)uVar9,"walking");
        return uVar9;
      }
      if (ref_agents->agent[local_5c].mode != REF_AGENT_ENCLOSING) {
        ref_interp->agent_hired[lVar8] = 0;
        uVar9 = ref_agents_remove(ref_agents,local_5c);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 2000,"ref_interp_locate_between",(ulong)uVar9,"no longer needed");
          return uVar9;
        }
        local_5c = -1;
      }
    }
  }
  lVar10 = (long)local_5c;
  if (lVar10 != -1) {
    pRVar6 = ref_agents->agent;
    if (pRVar6[lVar10].mode == REF_AGENT_ENCLOSING) {
      ref_interp->cell[lVar8] = pRVar6[lVar10].seed;
      ref_interp->part[lVar8] = pRVar6[local_5c].part;
      pRVar7 = ref_interp->bary;
      lVar10 = 0;
      do {
        pRVar7[node * 4 + lVar10] = pRVar6[local_5c].bary[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ref_interp->walk_steps = pRVar6[local_5c].step + ref_interp->walk_steps + 1;
      ref_interp->n_walk = ref_interp->n_walk + 1;
    }
    else {
      ref_interp->cell[lVar8] = -1;
    }
    ref_interp->agent_hired[lVar8] = 0;
    uVar9 = ref_agents_remove(ref_agents,local_5c);
    if (uVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x7e3,"ref_interp_locate_between",(ulong)uVar9,"no longer needed");
      return uVar9;
    }
  }
  if (1 < local_40->n) {
    return 0;
  }
  if (ref_interp->cell[lVar8] != -1) {
    return 0;
  }
  uVar9 = ref_list_create(&local_38);
  if (uVar9 == 0) {
    uVar9 = ref_search_touching(ref_interp->ref_search,local_38,local_58->real + new_node * 0xf,
                                ref_interp->search_fuzz);
    if (uVar9 == 0) {
      if (0 < local_38->n) {
        if (ref_interp->from_grid->twod == 0) {
          uVar9 = ref_interp_enclosing_tet_in_list
                            (ref_interp,local_38,local_58->real + new_node * 0xf,
                             ref_interp->cell + local_48,ref_interp->bary + (new_node << 2));
          if (uVar9 != 0) {
            uVar11 = 0x7fa;
            goto LAB_00120068;
          }
        }
        else {
          uVar9 = ref_interp_enclosing_tri_in_list
                            (ref_interp,local_38,local_58->real + new_node * 0xf,
                             ref_interp->cell + local_48,ref_interp->bary + (new_node << 2));
          if (uVar9 != 0) {
            uVar11 = 0x7f4;
LAB_00120068:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar11,"ref_interp_locate_between",(ulong)uVar9,"best in list");
            unaff_EBP = uVar9;
          }
        }
        if (uVar9 != 0) goto LAB_0011ffaf;
      }
      uVar9 = ref_list_free(local_38);
      bVar12 = uVar9 == 0;
      if (!bVar12) {
        bVar12 = false;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7fd,"ref_interp_locate_between",(ulong)uVar9,"free list");
        unaff_EBP = uVar9;
      }
      goto LAB_0011ffb2;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7ed,
           "ref_interp_locate_between",(ulong)uVar9,"tch");
    unaff_EBP = uVar9;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7e9,
           "ref_interp_locate_between",(ulong)uVar9,"create list");
    unaff_EBP = uVar9;
  }
LAB_0011ffaf:
  bVar12 = false;
LAB_0011ffb2:
  if (bVar12) {
    return 0;
  }
  return unaff_EBP;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_between(REF_INTERP ref_interp,
                                             REF_INT node0, REF_INT node1,
                                             REF_INT new_node) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");

  ref_mpi = ref_interp_mpi(ref_interp);
  ref_grid = ref_interp_to_grid(ref_interp);
  ref_node = ref_grid_node(ref_grid);
  if (new_node >= ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(ref_node)), "resize");
  }
  ref_interp->cell[new_node] = REF_EMPTY; /* initialize new_node locate */

  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  id = REF_EMPTY;

  if (id == REF_EMPTY && node0 != REF_EMPTY &&
      REF_EMPTY != ref_interp->cell[node0] &&
      ref_mpi_rank(ref_mpi) == ref_interp->part[node0]) {
    ref_interp->agent_hired[new_node] = REF_TRUE;
    RSS(ref_agents_push(ref_agents, new_node, ref_interp->part[node0],
                        ref_interp->cell[node0],
                        ref_node_xyz_ptr(ref_node, new_node), &id),
        "requeue");
    REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "not walking?");
    RSS(ref_interp_walk_agent(ref_interp, id), "walking");
    if (REF_AGENT_ENCLOSING != ref_agent_mode(ref_agents, id)) {
      ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
      RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      id = REF_EMPTY;
    }
  }

  if (id == REF_EMPTY && node1 != REF_EMPTY &&
      REF_EMPTY != ref_interp->cell[node1] &&
      ref_mpi_rank(ref_mpi) == ref_interp->part[node1]) {
    ref_interp->agent_hired[new_node] = REF_TRUE;
    RSS(ref_agents_push(ref_agents, new_node, ref_interp->part[node1],
                        ref_interp->cell[node1],
                        ref_node_xyz_ptr(ref_node, new_node), &id),
        "requeue");
    REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "not walking?");
    RSS(ref_interp_walk_agent(ref_interp, id), "walking");
    if (REF_AGENT_ENCLOSING != ref_agent_mode(ref_agents, id)) {
      ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
      RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      id = REF_EMPTY;
    }
  }

  if (id != REF_EMPTY) {
    if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
      ref_interp->cell[new_node] = ref_agent_seed(ref_agents, id);
      ref_interp->part[new_node] = ref_agent_part(ref_agents, id);
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * new_node] = ref_agent_bary(ref_agents, i, id);
      (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
      (ref_interp->n_walk)++;
    } else {
      /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
      /* what for parallel REF_AGENT_HOP_PART */
      ref_interp->cell[new_node] = REF_EMPTY;
    }
    ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
    RSS(ref_agents_remove(ref_agents, id), "no longer needed");
  }

  if (!ref_mpi_para(ref_mpi) && REF_EMPTY == ref_interp->cell[new_node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, new_node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, new_node),
                &(ref_interp->cell[new_node]),
                &(ref_interp->bary[4 * new_node])),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, new_node),
                &(ref_interp->cell[new_node]),
                &(ref_interp->bary[4 * new_node])),
            "best in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}